

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O1

void __thiscall FIX::Mutex::lock(Mutex *this)

{
  int iVar1;
  pthread_t pVar2;
  pthread_t pVar3;
  
  iVar1 = this->m_count;
  if ((iVar1 != 0) && (pVar3 = this->m_threadID, pVar2 = pthread_self(), pVar3 == pVar2)) {
    this->m_count = iVar1 + 1;
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  this->m_count = this->m_count + 1;
  pVar3 = pthread_self();
  this->m_threadID = pVar3;
  return;
}

Assistant:

void lock() {
#ifdef _MSC_VER
    EnterCriticalSection(&m_mutex);
#else
    if (m_count && m_threadID == pthread_self()) {
      ++m_count;
      return;
    }
    pthread_mutex_lock(&m_mutex);
    ++m_count;
    m_threadID = pthread_self();
#endif
  }